

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_VerifyRecoverInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR param_2,
          CK_OBJECT_HANDLE param_3)

{
  int iVar1;
  CK_RV CVar2;
  Session *this_00;
  
  CVar2 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar2 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      CVar2 = 0x90;
      if (iVar1 == 0) {
        CVar2 = 0x54;
      }
    }
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::C_VerifyRecoverInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR /*pMechanism*/, CK_OBJECT_HANDLE /*hKey*/)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	return CKR_FUNCTION_NOT_SUPPORTED;
}